

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::dummyCommandQueue(CLIntercept *this,cl_context context,cl_device_id device)

{
  mutex *__mutex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  cl_command_queue p_Var3;
  undefined8 uVar4;
  pointer unaff_R13;
  float __x;
  double __x_00;
  cl_int errorCode;
  cl_command_queue_properties props;
  cl_int local_54;
  string local_50;
  byte local_30 [8];
  
  if ((this->m_Config).DummyOutOfOrderQueue == true) {
    (*(this->m_Dispatch).clGetDeviceInfo)(device,0x102a,8,local_30,(size_t *)0x0);
    if ((local_30[0] & 1) != 0) {
      __mutex = &this->m_Mutex;
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar2 != 0) {
        uVar4 = std::__throw_system_error(iVar2);
        if (local_50._M_dataplus._M_p != unaff_R13) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        _Unwind_Resume(uVar4);
      }
      paVar1 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Creating and destroying a dummy out-of-order queue.\n","");
      log(this,__x_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      local_54 = 0;
      p_Var3 = (*(this->m_Dispatch).clCreateCommandQueue)(context,device,1,&local_54);
      if (local_54 == 0) {
        (*(this->m_Dispatch).clReleaseCommandQueue)(p_Var3);
      }
      else {
        CEnumNameMap::name_abi_cxx11_(&local_50,&this->m_EnumNameMap,local_54);
        logf(this,__x);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
  }
  return;
}

Assistant:

void CLIntercept::dummyCommandQueue(
    cl_context context,
    cl_device_id device )
{
    if( config().DummyOutOfOrderQueue )
    {
        cl_command_queue_properties props;
        dispatch().clGetDeviceInfo(
            device,
            CL_DEVICE_QUEUE_ON_HOST_PROPERTIES,
            sizeof(props),
            &props,
            NULL );
        if( props & CL_QUEUE_OUT_OF_ORDER_EXEC_MODE_ENABLE )
        {
            std::lock_guard<std::mutex> lock(m_Mutex);

            log( "Creating and destroying a dummy out-of-order queue.\n" );

            cl_int  errorCode = CL_SUCCESS;
            cl_command_queue dummy = dispatch().clCreateCommandQueue(
                context,
                device,
                CL_QUEUE_OUT_OF_ORDER_EXEC_MODE_ENABLE,
                &errorCode );
            if( errorCode == CL_SUCCESS )
            {
                dispatch().clReleaseCommandQueue( dummy );
            }
            else
            {
                logf( "Error creating dummy command queue!  %s (%i)\n",
                    enumName().name( errorCode ).c_str(),
                    errorCode );
            }
        }
    }
}